

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

BlobProtoVector * __thiscall caffe::BlobProtoVector::New(BlobProtoVector *this,Arena *arena)

{
  BlobProtoVector *this_00;
  
  this_00 = (BlobProtoVector *)operator_new(0x30);
  BlobProtoVector(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::BlobProtoVector>(arena,this_00);
  }
  return this_00;
}

Assistant:

BlobProtoVector* BlobProtoVector::New(::google::protobuf::Arena* arena) const {
  BlobProtoVector* n = new BlobProtoVector;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}